

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::AttributePack::render
          (AttributePack *this,Primitive primitive,DrawMethod drawMethod,int firstVertex,
          int vertexCount,IndexType indexType,void *indexOffset,int rangeStart,int rangeEnd,
          int instanceCount,int indirectOffset,int baseVertex,float coordScale,float colorScale,
          AttributeArray *indexArray)

{
  InputType IVar1;
  Context *pCVar2;
  pointer ppAVar3;
  byte bVar4;
  deUint32 dVar5;
  uint uVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  AttributeArray *pAVar13;
  char *pcVar14;
  int arrayNdx;
  long lVar15;
  char *in_stack_fffffffffffffde8;
  undefined8 local_1d8 [4];
  stringstream attribName;
  ostringstream local_1b0 [8];
  ostream local_1a8 [376];
  
  (*this->m_ctx->_vptr_Context[5])
            (this->m_ctx,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)this->m_programID);
  dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar5,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                  ,0x78f);
  pCVar2 = this->m_ctx;
  uVar6 = (*pCVar2->_vptr_Context[0x66])(pCVar2,(ulong)this->m_programID,"u_coordScale");
  (*pCVar2->_vptr_Context[0x5a])(coordScale,pCVar2,(ulong)uVar6);
  pCVar2 = this->m_ctx;
  uVar6 = (*pCVar2->_vptr_Context[0x66])(pCVar2,(ulong)this->m_programID,"u_colorScale");
  (*pCVar2->_vptr_Context[0x5a])(colorScale,pCVar2,(ulong)uVar6);
  if (this->m_useVao == true) {
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,(ulong)this->m_vaoID);
  }
  if ((indexArray != (AttributeArray *)0x0) && (indexArray->m_storage == STORAGE_BUFFER)) {
    (*indexArray->m_ctx->_vptr_Context[0x25])
              (indexArray->m_ctx,0x8893,(ulong)indexArray->m_glBuffer);
  }
  for (lVar15 = 0;
      lVar15 < (int)((ulong)((long)(this->m_arrays).
                                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_arrays).
                                  super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar15 = lVar15 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&attribName);
    poVar7 = std::operator<<(local_1a8,"a_");
    std::ostream::operator<<(poVar7,(int)lVar15);
    pCVar2 = this->m_ctx;
    uVar6 = this->m_programID;
    std::__cxx11::stringbuf::str();
    uVar6 = (*pCVar2->_vptr_Context[0x59])(pCVar2,(ulong)uVar6,local_1d8[0]);
    std::__cxx11::string::~string((string *)local_1d8);
    pAVar13 = (this->m_arrays).
              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar15];
    bVar4 = pAVar13->m_bound;
    if ((bool)bVar4 == true) {
      (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)uVar6);
      dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar5,"glEnableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,0x7a4);
      pAVar13 = (this->m_arrays).
                super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar15];
      bVar4 = pAVar13->m_bound;
    }
    if ((bVar4 & 1) == 0) {
      IVar1 = pAVar13->m_inputType;
      if (IVar1 == INPUTTYPE_UNSIGNED_INT) {
        lVar9 = 0x2c0;
LAB_006ddc45:
        (**(code **)((long)pAVar13->m_ctx->_vptr_Context + lVar9))
                  (pAVar13->m_ctx,uVar6,(pAVar13->m_defaultAttrib).v.uData[0],
                   (pAVar13->m_defaultAttrib).v.uData[1],(pAVar13->m_defaultAttrib).v.uData[2],
                   (pAVar13->m_defaultAttrib).v.uData[3]);
      }
      else {
        if (IVar1 == INPUTTYPE_INT) {
          lVar9 = 0x2b8;
          goto LAB_006ddc45;
        }
        if ((IVar1 == INPUTTYPE_FLOAT) && (pAVar13->m_componentCount - 1U < 4)) {
          switch(pAVar13->m_componentCount) {
          case 1:
            (*pAVar13->m_ctx->_vptr_Context[0x53])();
            break;
          case 2:
            (*pAVar13->m_ctx->_vptr_Context[0x54])();
            break;
          case 3:
            (*pAVar13->m_ctx->_vptr_Context[0x55])();
            break;
          case 4:
            (*pAVar13->m_ctx->_vptr_Context[0x56])
                      ((pAVar13->m_defaultAttrib).v.uData[0],(pAVar13->m_defaultAttrib).v.uData[1],
                       (pAVar13->m_defaultAttrib).v.uData[2],(pAVar13->m_defaultAttrib).v.uData[3]);
          }
        }
      }
    }
    else {
      if (pAVar13->m_storage == STORAGE_USER) {
        (*pAVar13->m_ctx->_vptr_Context[0x25])
                  (pAVar13->m_ctx,
                   (ulong)*(uint *)((long)&(anonymous_namespace)::
                                           targetToGL(deqp::gls::DrawTestSpec::Target)::targets +
                                   (long)(int)pAVar13->m_target * 4),0);
        dVar5 = (*pAVar13->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar5,"glBindBuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                        ,0x438);
        pcVar14 = pAVar13->m_data;
      }
      else {
        if (pAVar13->m_storage == STORAGE_BUFFER) {
          (*pAVar13->m_ctx->_vptr_Context[0x25])
                    (pAVar13->m_ctx,
                     (ulong)*(uint *)((long)&(anonymous_namespace)::
                                             targetToGL(deqp::gls::DrawTestSpec::Target)::targets +
                                     (long)(int)pAVar13->m_target * 4),(ulong)pAVar13->m_glBuffer);
          dVar5 = (*pAVar13->m_ctx->_vptr_Context[0x79])();
          glu::checkError(dVar5,"glBindBuffer()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                          ,0x431);
        }
        pcVar14 = (char *)0x0;
      }
      uVar8 = (ulong)(int)pAVar13->m_inputType;
      if ((uVar8 < 10) && ((0x207U >> (pAVar13->m_inputType & 0x1f) & 1) != 0)) {
        in_stack_fffffffffffffde8 = pcVar14 + pAVar13->m_offset;
        (*pAVar13->m_ctx->_vptr_Context[0x4e])
                  (pAVar13->m_ctx,(ulong)uVar6,(ulong)(uint)pAVar13->m_componentCount,
                   (ulong)*(uint *)((anonymous_namespace)::
                                    inputTypeToGL(deqp::gls::DrawTestSpec::InputType)::types +
                                   uVar8 * 4),(ulong)pAVar13->m_normalize,
                   (ulong)(uint)pAVar13->m_stride,in_stack_fffffffffffffde8);
        dVar5 = (*pAVar13->m_ctx->_vptr_Context[0x79])();
        iVar11 = 0x45c;
LAB_006ddc0b:
        pcVar14 = "glVertexAttribPointer()";
      }
      else {
        if (pAVar13->m_outputType < OUTPUTTYPE_INT) {
          uVar12 = 0x80e1;
          if (pAVar13->m_bgraOrder == false) {
            uVar12 = (ulong)(uint)pAVar13->m_componentCount;
          }
          in_stack_fffffffffffffde8 = pcVar14 + pAVar13->m_offset;
          (*pAVar13->m_ctx->_vptr_Context[0x4e])
                    (pAVar13->m_ctx,(ulong)uVar6,uVar12,
                     (ulong)*(uint *)((anonymous_namespace)::
                                      inputTypeToGL(deqp::gls::DrawTestSpec::InputType)::types +
                                     uVar8 * 4),(ulong)pAVar13->m_normalize,
                     (ulong)(uint)pAVar13->m_stride,in_stack_fffffffffffffde8);
          dVar5 = (*pAVar13->m_ctx->_vptr_Context[0x79])();
          iVar11 = 1099;
          goto LAB_006ddc0b;
        }
        (*pAVar13->m_ctx->_vptr_Context[0x4f])
                  (pAVar13->m_ctx,(ulong)uVar6,(ulong)(uint)pAVar13->m_componentCount,
                   (ulong)*(uint *)((anonymous_namespace)::
                                    inputTypeToGL(deqp::gls::DrawTestSpec::InputType)::types +
                                   uVar8 * 4),(ulong)(uint)pAVar13->m_stride,
                   pcVar14 + pAVar13->m_offset);
        dVar5 = (*pAVar13->m_ctx->_vptr_Context[0x79])();
        iVar11 = 0x451;
        pcVar14 = "glVertexAttribIPointer()";
      }
      glu::checkError(dVar5,pcVar14,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,iVar11);
      if (pAVar13->m_instanceDivisor != 0) {
        (*pAVar13->m_ctx->_vptr_Context[0x52])();
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&attribName);
  }
  if (DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX < drawMethod) goto LAB_006de4ce;
  lVar9 = (long)(int)indexType;
  lVar15 = (long)indirectOffset;
  uVar8 = (ulong)(uint)vertexCount;
  switch(drawMethod) {
  case DRAWMETHOD_DRAWARRAYS:
    (*this->m_ctx->_vptr_Context[0x68])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)firstVertex,uVar8);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawArrays()";
    iVar11 = 0x7ad;
    break;
  case DRAWMETHOD_DRAWARRAYS_INSTANCED:
    (*this->m_ctx->_vptr_Context[0x69])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)firstVertex,uVar8,
               (ulong)(uint)instanceCount);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawArraysInstanced()";
    iVar11 = 0x7b2;
    break;
  case DRAWMETHOD_DRAWARRAYS_INDIRECT:
    pvVar10 = operator_new__(lVar15 + 0x10U);
    *(int *)((long)pvVar10 + lVar15) = vertexCount;
    *(int *)((long)pvVar10 + lVar15 + 4) = instanceCount;
    *(int *)((long)pvVar10 + lVar15 + 8) = firstVertex;
    *(undefined4 *)((long)pvVar10 + lVar15 + 0xc) = 0;
    if (this->m_logEnabled == true) {
      _attribName = this->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,"DrawArraysIndirectCommand:\n");
      std::operator<<((ostream *)local_1b0,"\tcount: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      std::operator<<((ostream *)local_1b0,"\tprimCount: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      std::operator<<((ostream *)local_1b0,"\tfirst: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      std::operator<<((ostream *)local_1b0,"\treservedMustBeZero: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&attribName,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
    _attribName = (TestLog *)((ulong)_attribName & 0xffffffff00000000);
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,&attribName);
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8f3f,(ulong)_attribName & 0xffffffff);
    (*this->m_ctx->_vptr_Context[0x28])(this->m_ctx,0x8f3f,lVar15 + 0x10U,pvVar10,0x88e4);
    operator_delete__(pvVar10);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar5,"Setup draw indirect buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x7e9);
    (*this->m_ctx->_vptr_Context[0x70])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)indirectOffset);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    iVar11 = 0x7ec;
    goto LAB_006de453;
  case DRAWMETHOD_DRAWELEMENTS:
    (*this->m_ctx->_vptr_Context[0x6a])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),uVar8,
               (ulong)*(uint *)((anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               lVar9 * 4),indexOffset);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawElements()";
    iVar11 = 0x7b7;
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED:
    (*this->m_ctx->_vptr_Context[0x6e])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)rangeStart,
               (ulong)(uint)rangeEnd,uVar8,
               (ulong)*(uint *)((anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               lVar9 * 4),indexOffset);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawRangeElements()";
    iVar11 = 0x7bc;
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED:
    (*this->m_ctx->_vptr_Context[0x6b])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),uVar8,
               (ulong)*(uint *)((anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               lVar9 * 4),indexOffset);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawElementsInstanced()";
    iVar11 = 0x7c1;
    break;
  case DRAWMETHOD_DRAWELEMENTS_INDIRECT:
    pvVar10 = operator_new__(lVar15 + 0x14U);
    iVar11 = DrawTestSpec::indexTypeSize::size[lVar9];
    *(int *)((long)pvVar10 + lVar15) = vertexCount;
    *(int *)((long)pvVar10 + lVar15 + 4) = instanceCount;
    *(int *)((long)pvVar10 + lVar15 + 8) = (int)((long)indexOffset / (long)iVar11);
    *(int *)((long)pvVar10 + lVar15 + 0xc) = baseVertex;
    *(undefined4 *)((long)pvVar10 + lVar15 + 0x10) = 0;
    if (this->m_logEnabled == true) {
      _attribName = this->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,"DrawElementsIndirectCommand:\n");
      std::operator<<((ostream *)local_1b0,"\tcount: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      std::operator<<((ostream *)local_1b0,"\tprimCount: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      std::operator<<((ostream *)local_1b0,"\tfirstIndex: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      std::operator<<((ostream *)local_1b0,"\tbaseVertex: ");
      std::ostream::operator<<(local_1b0,baseVertex);
      std::operator<<((ostream *)local_1b0,"\n");
      std::operator<<((ostream *)local_1b0,"\treservedMustBeZero: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::operator<<((ostream *)local_1b0,"\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&attribName,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
    _attribName = (TestLog *)((ulong)_attribName & 0xffffffff00000000);
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,&attribName);
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,0x8f3f,(ulong)_attribName & 0xffffffff);
    (*this->m_ctx->_vptr_Context[0x28])(this->m_ctx,0x8f3f,lVar15 + 0x14U,pvVar10,0x88e4);
    operator_delete__(pvVar10);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar5,"Setup draw indirect buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x81c);
    (*this->m_ctx->_vptr_Context[0x71])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),
               (ulong)*(uint *)((anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               lVar9 * 4),(ulong)(uint)indirectOffset);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    iVar11 = 0x81f;
LAB_006de453:
    glu::checkError(dVar5,"glDrawArraysIndirect()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,iVar11);
    (*this->m_ctx->_vptr_Context[0x27])(this->m_ctx,1,&attribName);
    goto LAB_006de4ce;
  case DRAWMETHOD_DRAWELEMENTS_BASEVERTEX:
    (*this->m_ctx->_vptr_Context[0x6c])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),uVar8,
               (ulong)*(uint *)((anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               lVar9 * 4),indexOffset,(ulong)(uint)baseVertex);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawElementsBaseVertex()";
    iVar11 = 0x826;
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX:
    (*this->m_ctx->_vptr_Context[0x6d])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),uVar8,
               (ulong)*(uint *)((anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               lVar9 * 4),indexOffset,(ulong)(uint)instanceCount,
               CONCAT44((int)((ulong)in_stack_fffffffffffffde8 >> 0x20),baseVertex));
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawElementsInstancedBaseVertex()";
    iVar11 = 0x82b;
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX:
    (*this->m_ctx->_vptr_Context[0x6f])
              (this->m_ctx,
               (ulong)*(uint *)((anonymous_namespace)::
                                primitiveToGL(deqp::gls::DrawTestSpec::Primitive)::primitives +
                               (long)(int)primitive * 4),(ulong)(uint)rangeStart,
               (ulong)(uint)rangeEnd,uVar8,
               (ulong)*(uint *)((anonymous_namespace)::
                                indexTypeToGL(deqp::gls::DrawTestSpec::IndexType)::indexTypes +
                               lVar9 * 4),indexOffset,baseVertex);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    pcVar14 = "glDrawRangeElementsBaseVertex()";
    iVar11 = 0x830;
  }
  glu::checkError(dVar5,pcVar14,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                  ,iVar11);
LAB_006de4ce:
  lVar15 = 0;
  while( true ) {
    ppAVar3 = (this->m_arrays).
              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_arrays).
                            super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar3) >> 3) <=
        lVar15) break;
    if (ppAVar3[lVar15]->m_bound == true) {
      std::__cxx11::stringstream::stringstream((stringstream *)&attribName);
      poVar7 = std::operator<<(local_1a8,"a_");
      std::ostream::operator<<(poVar7,(int)lVar15);
      pCVar2 = this->m_ctx;
      uVar6 = this->m_programID;
      std::__cxx11::stringbuf::str();
      uVar6 = (*pCVar2->_vptr_Context[0x59])(pCVar2,(ulong)uVar6,local_1d8[0]);
      std::__cxx11::string::~string((string *)local_1d8);
      (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)uVar6);
      dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar5,"glDisableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                      ,0x83f);
      std::__cxx11::stringstream::~stringstream((stringstream *)&attribName);
    }
    lVar15 = lVar15 + 1;
  }
  if (this->m_useVao != false) {
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,0);
  }
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  (*this->m_ctx->_vptr_Context[0x80])
            (this->m_ctx,&this->m_screen,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  return;
}

Assistant:

void AttributePack::render (DrawTestSpec::Primitive primitive, DrawTestSpec::DrawMethod drawMethod, int firstVertex, int vertexCount, DrawTestSpec::IndexType indexType, const void* indexOffset, int rangeStart, int rangeEnd, int instanceCount, int indirectOffset, int baseVertex, float coordScale, float colorScale, AttributeArray* indexArray)
{
	DE_ASSERT(m_program != DE_NULL);
	DE_ASSERT(m_programID != 0);

	m_ctx.viewport(0, 0, m_screen.getWidth(), m_screen.getHeight());
	m_ctx.clearColor(0.0, 0.0, 0.0, 1.0);
	m_ctx.clear(GL_COLOR_BUFFER_BIT);

	m_ctx.useProgram(m_programID);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glUseProgram()");

	m_ctx.uniform1f(m_ctx.getUniformLocation(m_programID, "u_coordScale"), coordScale);
	m_ctx.uniform1f(m_ctx.getUniformLocation(m_programID, "u_colorScale"), colorScale);

	if (m_useVao)
		m_ctx.bindVertexArray(m_vaoID);

	if (indexArray)
		indexArray->bindIndexArray(DrawTestSpec::TARGET_ELEMENT_ARRAY);

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		std::stringstream attribName;
		attribName << "a_" << arrayNdx;

		deUint32 loc = m_ctx.getAttribLocation(m_programID, attribName.str().c_str());

		if (m_arrays[arrayNdx]->isBound())
		{
			m_ctx.enableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glEnableVertexAttribArray()");
		}

		m_arrays[arrayNdx]->bindAttribute(loc);
	}

	if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS)
	{
		m_ctx.drawArrays(primitiveToGL(primitive), firstVertex, vertexCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArrays()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		m_ctx.drawArraysInstanced(primitiveToGL(primitive), firstVertex, vertexCount, instanceCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysInstanced()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS)
	{
		m_ctx.drawElements(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElements()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		m_ctx.drawRangeElements(primitiveToGL(primitive), rangeStart, rangeEnd, vertexCount, indexTypeToGL(indexType), indexOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawRangeElements()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		m_ctx.drawElementsInstanced(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, instanceCount);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsInstanced()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		struct DrawCommand
		{
			GLuint count;
			GLuint primCount;
			GLuint first;
			GLuint reservedMustBeZero;
		};
		deUint8* buffer = new deUint8[sizeof(DrawCommand) + indirectOffset];

		{
			DrawCommand command;

			command.count				= vertexCount;
			command.primCount			= instanceCount;
			command.first				= firstVertex;
			command.reservedMustBeZero	= 0;

			memcpy(buffer + indirectOffset, &command, sizeof(command));

			if (m_logEnabled)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "DrawArraysIndirectCommand:\n"
					<< "\tcount: " << command.count << "\n"
					<< "\tprimCount: " << command.primCount << "\n"
					<< "\tfirst: " << command.first << "\n"
					<< "\treservedMustBeZero: " << command.reservedMustBeZero << "\n"
					<< tcu::TestLog::EndMessage;
		}

		GLuint indirectBuf = 0;
		m_ctx.genBuffers(1, &indirectBuf);
		m_ctx.bindBuffer(GL_DRAW_INDIRECT_BUFFER, indirectBuf);
		m_ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawCommand) + indirectOffset, buffer, GL_STATIC_DRAW);
		delete [] buffer;

		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "Setup draw indirect buffer");

		m_ctx.drawArraysIndirect(primitiveToGL(primitive), (const deInt8*)DE_NULL + indirectOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysIndirect()");

		m_ctx.deleteBuffers(1, &indirectBuf);
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		struct DrawCommand
		{
			GLuint count;
			GLuint primCount;
			GLuint firstIndex;
			GLint  baseVertex;
			GLuint reservedMustBeZero;
		};
		deUint8* buffer = new deUint8[sizeof(DrawCommand) + indirectOffset];

		{
			DrawCommand command;

			// index offset must be converted to firstIndex by dividing with the index element size
			DE_ASSERT(((const deUint8*)indexOffset - (const deUint8*)DE_NULL) % gls::DrawTestSpec::indexTypeSize(indexType) == 0); // \note This is checked in spec validation

			command.count				= vertexCount;
			command.primCount			= instanceCount;
			command.firstIndex			= (glw::GLuint)(((const deUint8*)indexOffset - (const deUint8*)DE_NULL) / gls::DrawTestSpec::indexTypeSize(indexType));
			command.baseVertex			= baseVertex;
			command.reservedMustBeZero	= 0;

			memcpy(buffer + indirectOffset, &command, sizeof(command));

			if (m_logEnabled)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "DrawElementsIndirectCommand:\n"
					<< "\tcount: " << command.count << "\n"
					<< "\tprimCount: " << command.primCount << "\n"
					<< "\tfirstIndex: " << command.firstIndex << "\n"
					<< "\tbaseVertex: " << command.baseVertex << "\n"
					<< "\treservedMustBeZero: " << command.reservedMustBeZero << "\n"
					<< tcu::TestLog::EndMessage;
		}

		GLuint indirectBuf = 0;
		m_ctx.genBuffers(1, &indirectBuf);
		m_ctx.bindBuffer(GL_DRAW_INDIRECT_BUFFER, indirectBuf);
		m_ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawCommand) + indirectOffset, buffer, GL_STATIC_DRAW);
		delete [] buffer;

		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "Setup draw indirect buffer");

		m_ctx.drawElementsIndirect(primitiveToGL(primitive), indexTypeToGL(indexType), (const deInt8*)DE_NULL + indirectOffset);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArraysIndirect()");

		m_ctx.deleteBuffers(1, &indirectBuf);
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
	{
		m_ctx.drawElementsBaseVertex(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsBaseVertex()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX)
	{
		m_ctx.drawElementsInstancedBaseVertex(primitiveToGL(primitive), vertexCount, indexTypeToGL(indexType), indexOffset, instanceCount, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawElementsInstancedBaseVertex()");
	}
	else if (drawMethod == DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
	{
		m_ctx.drawRangeElementsBaseVertex(primitiveToGL(primitive), rangeStart, rangeEnd, vertexCount, indexTypeToGL(indexType), indexOffset, baseVertex);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawRangeElementsBaseVertex()");
	}
	else
		DE_ASSERT(DE_FALSE);

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << arrayNdx;

			deUint32 loc = m_ctx.getAttribLocation(m_programID, attribName.str().c_str());

			m_ctx.disableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDisableVertexAttribArray()");
		}
	}

	if (m_useVao)
		m_ctx.bindVertexArray(0);

	m_ctx.useProgram(0);
	m_ctx.readPixels(m_screen, 0, 0, m_screen.getWidth(), m_screen.getHeight());
}